

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageHeader_TokenLengthIsZero_Test::
CoapTest_CoapMessageHeader_TokenLengthIsZero_Test
          (CoapTest_CoapMessageHeader_TokenLengthIsZero_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00254b28;
  return;
}

Assistant:

TEST(CoapTest, CoapMessageHeader_TokenLengthIsZero)
{
    ByteArray buffer{'`', 0, 0, 1};
    Error     error;
    auto      message = Message::Deserialize(error, buffer);

    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetToken(), ByteArray{});
}